

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FieldDescriptorProto::SharedCtor(FieldDescriptorProto *this)

{
  this->_cached_size_ = 0;
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->extendee_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->type_name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->default_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->json_name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->options_ = (FieldOptions *)0x0;
  this->number_ = 0;
  this->oneof_index_ = 0;
  this->label_ = 1;
  this->type_ = 1;
  return;
}

Assistant:

void FieldDescriptorProto::SharedCtor() {
  _cached_size_ = 0;
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  extendee_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  type_name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  default_value_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  json_name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&options_, 0, reinterpret_cast<char*>(&oneof_index_) -
    reinterpret_cast<char*>(&options_) + sizeof(oneof_index_));
  label_ = 1;
  type_ = 1;
}